

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::FindEQ
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  Addr Cp;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> C;
  Addr local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_90,this->N);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar2 = (k->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar2,pcVar2 + k->_M_string_length)
  ;
  uVar5 = FindFirstKey(this,&local_b0,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  FindNode(this,local_b8,&local_90);
  if (uVar5 == 0xffffffff) {
LAB_0012acfb:
    if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90.k);
    return __return_storage_ptr__;
  }
LAB_0012abc8:
  uVar7 = (ulong)(int)uVar5;
  do {
    uVar10 = this->N - 1;
    uVar12 = (ulong)uVar10;
    if ((int)uVar5 < (int)uVar10) {
      uVar8 = (ulong)uVar5;
      uVar9 = uVar7;
      lVar13 = uVar7 * 8;
      if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar7] == '1') {
        while ((sVar3 = *(size_t *)
                         ((long)&(local_90.k.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                         lVar13 * 4), uVar8 = uVar9, sVar3 == k->_M_string_length &&
               ((sVar3 == 0 ||
                (iVar6 = bcmp(*(void **)((long)&((local_90.k.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                _M_dataplus)._M_p + lVar13 * 4),
                              (k->_M_dataplus)._M_p,sVar3), iVar6 == 0))))) {
          std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
          _M_insert_unique<Addr_const&>
                    ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>
                      *)__return_storage_ptr__,
                     (Addr *)((long)&(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->BlockNum + lVar13))
          ;
          uVar8 = uVar9 + 1;
          uVar12 = (long)this->N - 1;
          if (((long)uVar12 <= (long)uVar8) ||
             (lVar13 = lVar13 + 8, lVar4 = uVar9 + 1, uVar9 = uVar8,
             local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[lVar4] != '1')) break;
        }
      }
    }
    else {
      uVar8 = (ulong)uVar5;
    }
    iVar6 = (int)uVar8;
    iVar11 = (int)uVar12;
    if (((iVar6 == iVar11) ||
        (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start[iVar6] == '0')) &&
       (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar11].FileOff == -1)) goto LAB_0012acfb;
    if ((iVar6 == iVar11) ||
       (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar6] == '0')) break;
    sVar3 = local_90.k.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar6]._M_string_length;
    if ((sVar3 != k->_M_string_length) ||
       ((sVar3 != 0 &&
        (iVar6 = bcmp(local_90.k.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar6]._M_dataplus._M_p,
                      (k->_M_dataplus)._M_p,sVar3), iVar6 != 0)))) goto LAB_0012acfb;
  } while( true );
  uVar5 = 0;
  FindNode(this,local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                super__Vector_impl_data._M_start[iVar11],&local_90);
  goto LAB_0012abc8;
}

Assistant:

set<Addr> BpTree<K>::FindEQ(K k) {
	IndexNode<K> C(N);
	Addr Cp;
	int i;
	set<Addr> ret;
	int pos = this->FindFirstKey(k, Cp);
	this->FindNode(Cp, C);			//C.k[pos]�ǵ�һ����ֵΪk�ĵط�
	if (pos == -1)
		return ret;					//�Ҳ����ü�ֵ�����ؿ�����
	while (1) {
		for (i = pos; i < N - 1 && C.v[i] == '1' && C.k[i] == k; i++) {
			ret.insert(C.p[i]);
		}
		if ((i == N - 1 || C.v[i] == '0') && C.p[N - 1].FileOff == -1) {
			break;									//��ͷ��
		}
		else if (i == N - 1 || C.v[i] == '0') {		//��Ҷ���������һ�����
			pos = 0;
			this->FindNode(C.p[N - 1], C);
		}
		else if (C.k[i] != k) {
			break;									//�ҵ���һ���������������λ��
		}
	}
	return ret;
}